

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  bool bVar1;
  mapped_type *pmVar2;
  undefined8 *puVar3;
  FieldGenerator *pFVar4;
  int i;
  long lVar5;
  ulong uVar6;
  int j;
  long lVar7;
  string message_class;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  oneof_vars;
  string local_70;
  string local_50;
  
  for (uVar6 = 0; (long)uVar6 < (long)*(int *)(this->descriptor_ + 0x38); uVar6 = uVar6 + 1) {
    oneof_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    oneof_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    oneof_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &oneof_vars._M_t._M_impl.super__Rb_tree_header._M_header;
    oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    oneof_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         oneof_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_class,"classname",(allocator<char> *)&local_70);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&oneof_vars,&message_class);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&message_class);
    lVar5 = uVar6 * 0x30;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_class,"oneofname",(allocator<char> *)&local_70);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&oneof_vars,&message_class);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&message_class);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message_class,"full_name",(allocator<char> *)&local_70);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&oneof_vars,&message_class);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&message_class);
    message_class._M_dataplus._M_p = (pointer)&message_class.field_2;
    message_class._M_string_length = 0;
    message_class.field_2._M_local_buf[0] = '\0';
    io::Printer::Print(printer,&oneof_vars,
                       "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
                      );
    io::Printer::Indent(printer);
    io::Printer::Print(printer,&oneof_vars,"switch ($oneofname$_case()) {\n");
    io::Printer::Indent(printer);
    for (lVar7 = 0; puVar3 = (undefined8 *)(*(long *)(this->descriptor_ + 0x40) + lVar5),
        lVar7 < *(int *)(*(long *)(this->descriptor_ + 0x40) + 0x1c + lVar5); lVar7 = lVar7 + 1) {
      field = *(FieldDescriptor **)(puVar3[4] + lVar7 * 8);
      UnderscoresToCamelCase(&local_70,*(string **)field,true);
      io::Printer::Print(printer,"case k$field_name$: {\n","field_name",&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      io::Printer::Indent(printer);
      bVar1 = IsStringOrMessage(field);
      if (bVar1) {
        pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
        (*pFVar4->_vptr_FieldGenerator[9])(pFVar4,printer);
      }
      else {
        io::Printer::Print(printer,"// No need to clear\n");
      }
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
    ToUpper(&local_70,(string *)*puVar3);
    io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                       &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    io::Printer::Outdent(printer);
    SimpleItoa_abi_cxx11_(&local_70,(protobuf *)(uVar6 & 0xffffffff),i);
    ToUpper(&local_50,*(string **)(*(long *)(this->descriptor_ + 0x40) + lVar5));
    io::Printer::Print(printer,"}\n_oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n",
                       "oneof_index",&local_70,"cap_oneof_name",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    std::__cxx11::string::~string((string *)&message_class);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&oneof_vars._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateOneofClear(io::Printer* printer) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    std::map<string, string> oneof_vars;
    oneof_vars["classname"] = classname_;
    oneof_vars["oneofname"] = descriptor_->oneof_decl(i)->name();
    oneof_vars["full_name"] = descriptor_->full_name();
    string message_class;

    printer->Print(oneof_vars,
                   "void $classname$::clear_$oneofname$() {\n"
                   "// @@protoc_insertion_point(one_of_clear_start:"
                   "$full_name$)\n");
    printer->Indent();
    printer->Print(oneof_vars,
        "switch ($oneofname$_case()) {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field)) {
        printer->Print(
            "// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(printer);
      }
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n"
        "_oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n",
        "oneof_index", SimpleItoa(i),
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n"
        "\n");
  }
}